

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomBasisCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  const_iterator cVar9;
  mapped_type *this;
  _Rb_tree_node_base *p_Var10;
  char *pcVar11;
  char *pcVar12;
  Property *pPVar13;
  anon_struct_8_0_00000001_for___align aVar14;
  ParseResult ret;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined8 in_stack_fffffffffffffc18;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *target;
  string local_3e0;
  undefined1 local_3c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *local_398;
  Property *local_390;
  string *local_388;
  long *local_380 [2];
  long local_370 [2];
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap> *local_360;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *local_358;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type> *local_350;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  undefined1 local_318 [16];
  undefined1 local_308 [96];
  ios_base local_2a8 [280];
  string *local_190;
  storage_t<tinyusdz::Token> local_188;
  _Rb_tree_node_base *local_168;
  undefined1 local_160 [24];
  undefined8 local_148 [2];
  string local_138 [16];
  undefined1 local_128 [32];
  long local_108 [2];
  string local_f8 [16];
  undefined8 local_e8 [2];
  storage_t<tinyusdz::Token> local_d8;
  _Base_ptr *local_b8 [2];
  _Base_ptr local_a8 [2];
  _Any_data local_98;
  pointer local_88;
  pointer pSStack_80;
  _Any_data local_78;
  code *local_68;
  _Alloc_hider _Stack_60;
  undefined1 local_58 [24];
  _Alloc_hider _Stack_40;
  
  local_348._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348._M_impl.super__Rb_tree_header._M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  aVar14 = (anon_struct_8_0_00000001_for___align)0x0;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                    (uint)options->strict_allowedToken_check);
  local_398 = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)err;
  local_388 = warn;
  local_348._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_348,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&curves->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar5) {
    p_Var10 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_168 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    aVar14._1_7_ = 0;
    aVar14._0_1_ = p_Var10 == local_168;
    if (p_Var10 != local_168) {
      local_188._24_8_ = &curves->curveVertexCounts;
      local_188._16_8_ = &curves->points;
      local_188._8_8_ = &curves->velocities;
      local_188.data._0_8_ = (undefined8)&curves->normals;
      local_190 = (string *)&curves->accelerations;
      local_2a8._272_8_ = &curves->widths;
      local_2a8._264_8_ = &(curves->super_GPrim).props;
      local_360 = &curves->wrap;
      local_358 = &curves->basis;
      local_350 = &curves->type;
      do {
        local_b8[0] = local_a8;
        local_160._0_8_ = aVar14;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        pPVar13 = (Property *)local_318;
        local_318._0_8_ = local_308;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar13,"curveVertexCounts","");
        local_390 = (Property *)(p_Var10 + 2);
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  ((ParseResult *)local_3c0,(_anonymous_namespace_ *)&local_348,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8,(string *)(p_Var10 + 2),pPVar13,(string *)local_188._24_8_,target);
        if ((undefined1 *)local_318._0_8_ != local_308) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],(ulong)((long)&local_a8[0]->_M_color + 1));
        }
        aVar14 = (anon_struct_8_0_00000001_for___align)local_160._0_8_;
        iVar6 = 0;
        if ((local_3c0._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_001fabf3:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_3c0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_318,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_318,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_318,0xc35);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_380[0] = local_370;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_380,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[18],std::__cxx11::string>
                      (&local_3e0,(fmt *)local_380,(string *)"curveVertexCounts",
                       (char (*) [18])(local_3c0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar13)
            ;
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_318,local_3e0._M_dataplus._M_p,
                                local_3e0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar4 = local_398;
            if (local_380[0] != local_370) {
              operator_delete(local_380[0],local_370[0] + 1);
            }
            if (pTVar4 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                           *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_380,(ulong)(pTVar4->_metas).interpolation);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_3e0.field_2._M_allocated_capacity = *psVar1;
                local_3e0.field_2._8_8_ = plVar8[3];
                local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
              }
              else {
                local_3e0.field_2._M_allocated_capacity = *psVar1;
                local_3e0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_3e0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                operator_delete(local_3e0._M_dataplus._M_p,
                                local_3e0.field_2._M_allocated_capacity + 1);
              }
              if (local_380[0] != local_370) {
                operator_delete(local_380[0],local_370[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
            ::std::ios_base::~ios_base(local_2a8);
            iVar6 = 1;
            goto LAB_001fabf3;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._8_8_ != &local_3a8) {
          operator_delete((void *)local_3c0._8_8_,local_3a8._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_d8.data._0_8_ = (undefined8)((long)&local_d8 + 0x10);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          pPVar13 = (Property *)local_318;
          local_318._0_8_ = local_308;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar13,"points","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                    ((ParseResult *)local_3c0,(_anonymous_namespace_ *)&local_348,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_d8,(string *)local_390,pPVar13,(string *)local_188._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                      *)target);
          if ((undefined1 *)local_318._0_8_ != local_308) {
            operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
          }
          if (local_d8.data.__align !=
              (anon_struct_8_0_00000001_for___align)((long)&local_d8 + 0x10)) {
            operator_delete((void *)local_d8.data._0_8_,local_d8._16_8_ + 1);
          }
          iVar6 = 0;
          if ((local_3c0._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
LAB_001faf0c:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_3c0._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_318,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_318,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_318,0xc36);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_380[0] = local_370;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_380,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_3e0,(fmt *)local_380,(string *)"points",
                         (char (*) [7])(local_3c0 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar13);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_318,local_3e0._M_dataplus._M_p,
                                  local_3e0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                operator_delete(local_3e0._M_dataplus._M_p,
                                local_3e0.field_2._M_allocated_capacity + 1);
              }
              pTVar4 = local_398;
              if (local_380[0] != local_370) {
                operator_delete(local_380[0],local_370[0] + 1);
              }
              if (pTVar4 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                             *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar8 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_380,(ulong)(pTVar4->_metas).interpolation)
                ;
                psVar1 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3e0.field_2._M_allocated_capacity = *psVar1;
                  local_3e0.field_2._8_8_ = plVar8[3];
                  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
                }
                else {
                  local_3e0.field_2._M_allocated_capacity = *psVar1;
                  local_3e0._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_3e0._M_string_length = plVar8[1];
                *plVar8 = (long)psVar1;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                  operator_delete(local_3e0._M_dataplus._M_p,
                                  local_3e0.field_2._M_allocated_capacity + 1);
                }
                if (local_380[0] != local_370) {
                  operator_delete(local_380[0],local_370[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
              ::std::ios_base::~ios_base(local_2a8);
              iVar6 = 1;
              goto LAB_001faf0c;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._8_8_ != &local_3a8) {
            operator_delete((void *)local_3c0._8_8_,local_3a8._M_allocated_capacity + 1);
          }
          if (bVar5) {
            local_f8._0_8_ = local_e8;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_f8,*(long *)(p_Var10 + 1),
                       (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
            pPVar13 = (Property *)local_318;
            local_318._0_8_ = local_308;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar13,"velocities","");
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      ((ParseResult *)local_3c0,(_anonymous_namespace_ *)&local_348,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_f8,(string *)local_390,pPVar13,(string *)local_188._8_8_,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                        *)target);
            if ((undefined1 *)local_318._0_8_ != local_308) {
              operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
            }
            if ((undefined8 *)local_f8._0_8_ != local_e8) {
              operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
            }
            iVar6 = 0;
            if ((local_3c0._0_8_ & 0xfffffffd) == 0) {
              iVar6 = 3;
LAB_001fb225:
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (local_3c0._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_318,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_318,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_318,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_318,0xc38);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_380[0] = local_370;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_380,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[11],std::__cxx11::string>
                          (&local_3e0,(fmt *)local_380,(string *)"velocities",
                           (char (*) [11])(local_3c0 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar13);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_318,local_3e0._M_dataplus._M_p,
                                    local_3e0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                  operator_delete(local_3e0._M_dataplus._M_p,
                                  local_3e0.field_2._M_allocated_capacity + 1);
                }
                pTVar4 = local_398;
                if (local_380[0] != local_370) {
                  operator_delete(local_380[0],local_370[0] + 1);
                }
                if (pTVar4 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar8 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)local_380,
                                              (ulong)(pTVar4->_metas).interpolation);
                  psVar1 = (size_type *)(plVar8 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar8 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_3e0.field_2._M_allocated_capacity = *psVar1;
                    local_3e0.field_2._8_8_ = plVar8[3];
                    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
                  }
                  else {
                    local_3e0.field_2._M_allocated_capacity = *psVar1;
                    local_3e0._M_dataplus._M_p = (pointer)*plVar8;
                  }
                  local_3e0._M_string_length = plVar8[1];
                  *plVar8 = (long)psVar1;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                    operator_delete(local_3e0._M_dataplus._M_p,
                                    local_3e0.field_2._M_allocated_capacity + 1);
                  }
                  if (local_380[0] != local_370) {
                    operator_delete(local_380[0],local_370[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
                ::std::ios_base::~ios_base(local_2a8);
                iVar6 = 1;
                goto LAB_001fb225;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._8_8_ != &local_3a8) {
              operator_delete((void *)local_3c0._8_8_,local_3a8._M_allocated_capacity + 1);
            }
            if (bVar5) {
              local_128._16_8_ = local_108;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_128 + 0x10),*(long *)(p_Var10 + 1),
                         (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
              pPVar13 = (Property *)local_318;
              local_318._0_8_ = local_308;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar13,"normals","");
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                        ((ParseResult *)local_3c0,(_anonymous_namespace_ *)&local_348,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_128 + 0x10),(string *)local_390,pPVar13,
                         (string *)local_188.data._0_8_,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          *)target);
              if ((undefined1 *)local_318._0_8_ != local_308) {
                operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
              }
              if ((long *)local_128._16_8_ != local_108) {
                operator_delete((void *)local_128._16_8_,local_108[0] + 1);
              }
              iVar6 = 0;
              if ((local_3c0._0_8_ & 0xfffffffd) == 0) {
                iVar6 = 3;
LAB_001fb53e:
                bVar5 = false;
              }
              else {
                bVar5 = true;
                if (local_3c0._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_318,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_318,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_318,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"():",3)
                  ;
                  poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_318,0xc3a);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  local_380[0] = local_370;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_380,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[8],std::__cxx11::string>
                            (&local_3e0,(fmt *)local_380,(string *)"normals",
                             (char (*) [8])(local_3c0 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar13);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_318,local_3e0._M_dataplus._M_p,
                                      local_3e0._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                    operator_delete(local_3e0._M_dataplus._M_p,
                                    local_3e0.field_2._M_allocated_capacity + 1);
                  }
                  pTVar4 = local_398;
                  if (local_380[0] != local_370) {
                    operator_delete(local_380[0],local_370[0] + 1);
                  }
                  if (pTVar4 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                 *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar8 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)local_380,
                                                (ulong)(pTVar4->_metas).interpolation);
                    psVar1 = (size_type *)(plVar8 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar8 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_3e0.field_2._M_allocated_capacity = *psVar1;
                      local_3e0.field_2._8_8_ = plVar8[3];
                      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
                    }
                    else {
                      local_3e0.field_2._M_allocated_capacity = *psVar1;
                      local_3e0._M_dataplus._M_p = (pointer)*plVar8;
                    }
                    local_3e0._M_string_length = plVar8[1];
                    *plVar8 = (long)psVar1;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3e0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                      operator_delete(local_3e0._M_dataplus._M_p,
                                      local_3e0.field_2._M_allocated_capacity + 1);
                    }
                    if (local_380[0] != local_370) {
                      operator_delete(local_380[0],local_370[0] + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
                  ::std::ios_base::~ios_base(local_2a8);
                  iVar6 = 1;
                  goto LAB_001fb53e;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._8_8_ != &local_3a8) {
                operator_delete((void *)local_3c0._8_8_,local_3a8._M_allocated_capacity + 1);
              }
              if (bVar5) {
                local_138._0_8_ = local_128;
                ::std::__cxx11::string::_M_construct<char*>
                          (local_138,*(long *)(p_Var10 + 1),
                           (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
                pPVar13 = (Property *)local_318;
                local_318._0_8_ = local_308;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)pPVar13,"accelerations","");
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                          ((ParseResult *)local_3c0,(_anonymous_namespace_ *)&local_348,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138,(string *)local_390,pPVar13,local_190,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                            *)target);
                if ((undefined1 *)local_318._0_8_ != local_308) {
                  operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                }
                if ((undefined1 *)local_138._0_8_ != local_128) {
                  operator_delete((void *)local_138._0_8_,local_128._0_8_ + 1);
                }
                iVar6 = 0;
                if ((local_3c0._0_8_ & 0xfffffffd) == 0) {
                  iVar6 = 3;
LAB_001fb857:
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                  if (local_3c0._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_318,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_318,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_318,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_318,"():",3);
                    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_318,0xc3c)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    local_380[0] = local_370;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_380,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[14],std::__cxx11::string>
                              (&local_3e0,(fmt *)local_380,(string *)"accelerations",
                               (char (*) [14])(local_3c0 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar13);
                    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_318,local_3e0._M_dataplus._M_p,
                                        local_3e0._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                      operator_delete(local_3e0._M_dataplus._M_p,
                                      local_3e0.field_2._M_allocated_capacity + 1);
                    }
                    pTVar4 = local_398;
                    if (local_380[0] != local_370) {
                      operator_delete(local_380[0],local_370[0] + 1);
                    }
                    if (pTVar4 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                   *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar8 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)local_380,
                                                  (ulong)(pTVar4->_metas).interpolation);
                      psVar1 = (size_type *)(plVar8 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar8 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_3e0.field_2._M_allocated_capacity = *psVar1;
                        local_3e0.field_2._8_8_ = plVar8[3];
                        local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
                      }
                      else {
                        local_3e0.field_2._M_allocated_capacity = *psVar1;
                        local_3e0._M_dataplus._M_p = (pointer)*plVar8;
                      }
                      local_3e0._M_string_length = plVar8[1];
                      *plVar8 = (long)psVar1;
                      plVar8[1] = 0;
                      *(undefined1 *)(plVar8 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3e0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                        operator_delete(local_3e0._M_dataplus._M_p,
                                        local_3e0.field_2._M_allocated_capacity + 1);
                      }
                      if (local_380[0] != local_370) {
                        operator_delete(local_380[0],local_370[0] + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
                    ::std::ios_base::~ios_base(local_2a8);
                    iVar6 = 1;
                    goto LAB_001fb857;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._8_8_ != &local_3a8) {
                  operator_delete((void *)local_3c0._8_8_,local_3a8._M_allocated_capacity + 1);
                }
                if (bVar5) {
                  local_160._8_8_ = local_148;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)(local_160 + 8),*(long *)(p_Var10 + 1),
                             (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
                  pPVar13 = (Property *)local_318;
                  local_318._0_8_ = local_308;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar13,"widths","");
                  (anonymous_namespace)::
                  ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                            ((ParseResult *)local_3c0,(_anonymous_namespace_ *)&local_348,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(local_160 + 8),(string *)local_390,pPVar13,
                             (string *)local_2a8._272_8_,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                              *)target);
                  if ((undefined1 *)local_318._0_8_ != local_308) {
                    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                  }
                  if ((undefined8 *)local_160._8_8_ != local_148) {
                    operator_delete((void *)local_160._8_8_,local_148[0] + 1);
                  }
                  iVar6 = 0;
                  if ((local_3c0._0_8_ & 0xfffffffd) == 0) {
                    iVar6 = 3;
LAB_001fbb70:
                    bVar5 = false;
                  }
                  else {
                    bVar5 = true;
                    if (local_3c0._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_318,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_318,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_318,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_318,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_318,"():",3);
                      poVar7 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_318,0xc3d);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      local_380[0] = local_370;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_380,"Parsing attribute `{}` failed. Error: {}","");
                      fmt::format<char[7],std::__cxx11::string>
                                (&local_3e0,(fmt *)local_380,(string *)"widths",
                                 (char (*) [7])(local_3c0 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar13);
                      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_318,local_3e0._M_dataplus._M_p,
                                          local_3e0._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                        operator_delete(local_3e0._M_dataplus._M_p,
                                        local_3e0.field_2._M_allocated_capacity + 1);
                      }
                      pTVar4 = local_398;
                      if (local_380[0] != local_370) {
                        operator_delete(local_380[0],local_370[0] + 1);
                      }
                      if (pTVar4 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                     *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar8 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)local_380,
                                                    (ulong)(pTVar4->_metas).interpolation);
                        psVar1 = (size_type *)(plVar8 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar8 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar1) {
                          local_3e0.field_2._M_allocated_capacity = *psVar1;
                          local_3e0.field_2._8_8_ = plVar8[3];
                          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
                        }
                        else {
                          local_3e0.field_2._M_allocated_capacity = *psVar1;
                          local_3e0._M_dataplus._M_p = (pointer)*plVar8;
                        }
                        local_3e0._M_string_length = plVar8[1];
                        *plVar8 = (long)psVar1;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3e0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                          operator_delete(local_3e0._M_dataplus._M_p,
                                          local_3e0.field_2._M_allocated_capacity + 1);
                        }
                        if (local_380[0] != local_370) {
                          operator_delete(local_380[0],local_370[0] + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
                      ::std::ios_base::~ios_base(local_2a8);
                      iVar6 = 1;
                      goto LAB_001fbb70;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c0._8_8_ != &local_3a8) {
                    operator_delete((void *)local_3c0._8_8_,local_3a8._M_allocated_capacity + 1);
                  }
                  if (bVar5) {
                    __k = p_Var10 + 1;
                    iVar6 = ::std::__cxx11::string::compare((char *)__k);
                    if (iVar6 == 0) {
                      local_318._0_8_ = local_308;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_318,"type","");
                      cVar9 = ::std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::find(&local_348,(key_type *)local_318);
                      if ((undefined1 *)local_318._0_8_ != local_308) {
                        operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                      }
                      iVar6 = 3;
                      if ((_Rb_tree_header *)cVar9._M_node ==
                          &local_348._M_impl.super__Rb_tree_header) {
                        if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                          local_318._0_8_ = local_308;
                          local_318._8_8_ = 0;
                          local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
                        }
                        else {
                          Attribute::type_name_abi_cxx11_((string *)local_318,&local_390->_attrib);
                        }
                        local_3c0._0_8_ = local_3c0 + 0x10;
                        local_3c0[0x14] = 'n';
                        local_3c0._16_4_ = 0x656b6f74;
                        local_3c0._8_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x5;
                        local_3c0[0x15] = '\0';
                        if (((local_318._8_8_ == 5) &&
                            (iVar6 = bcmp((void *)local_318._0_8_,local_3c0 + 0x10,5), iVar6 == 0))
                           && (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), uVar3 < 2)) {
                          if ((undefined1 *)local_318._0_8_ != local_308) {
                            operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                          }
                          if (uVar3 == 0) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"[warn]",6);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"():",3);
                            poVar7 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_318,0xc3f);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"No value assigned to `",0x16);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"type",4);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,
                                       "` token attribute. Set default token value.",0x2b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"\n",1);
                            if (local_388 != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_3c0,&local_3e0,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_398);
                              ::std::__cxx11::string::operator=
                                        ((string *)local_388,(string *)local_3c0);
                              if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                                operator_delete((void *)local_3c0._0_8_,
                                                CONCAT26(local_3c0._22_2_,
                                                         CONCAT15(local_3c0[0x15],
                                                                  CONCAT14(local_3c0[0x14],
                                                                           local_3c0._16_4_))) + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                                operator_delete(local_3e0._M_dataplus._M_p,
                                                local_3e0.field_2._M_allocated_capacity + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_318);
                            ::std::ios_base::~ios_base(local_2a8);
                            AttrMetas::operator=(&local_350->_metas,(AttrMetas *)(p_Var10 + 7));
                            pcVar12 = "type";
                            pcVar11 = "";
LAB_001fc9b3:
                            iVar6 = 3;
                            local_318._0_8_ = local_308;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_318,pcVar12,pcVar11);
                            ::std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&local_348,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_318);
                            if ((undefined1 *)local_318._0_8_ != local_308) {
                              operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                            }
                            goto LAB_001fcbae;
                          }
                        }
                        else if ((undefined1 *)local_318._0_8_ != local_308) {
                          operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                        }
                        local_318._0_8_ = (pointer)0x0;
                        local_318._8_8_ = 0;
                        local_308._8_8_ =
                             ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3095:22)>
                             ::_M_invoke;
                        local_308._0_8_ =
                             ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3095:22)>
                             ::_M_manager;
                        local_3c0._0_8_ = local_3c0 + 0x10;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_3c0,"type","");
                        bVar5 = options->strict_allowedToken_check;
                        local_58._16_8_ = (code *)0x0;
                        _Stack_40._M_p = (pointer)0x0;
                        local_58._0_8_ = (void *)0x0;
                        local_58._8_8_ = 0;
                        if ((code *)local_308._0_8_ != (code *)0x0) {
                          (*(code *)local_308._0_8_)
                                    ((EnumHandlerFun<tinyusdz::GeomBasisCurves::Type> *)local_58,
                                     local_318,2);
                          local_58._16_8_ = local_308._0_8_;
                          _Stack_40._M_p = (pointer)local_308._8_8_;
                        }
                        target = local_398;
                        bVar5 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Type,tinyusdz::GeomBasisCurves::Type>
                                          ((string *)local_3c0,bVar5,
                                           (EnumHandlerFun<tinyusdz::GeomBasisCurves::Type> *)
                                           local_58,&local_390->_attrib,local_350,local_388,
                                           (string *)local_398);
                        if ((code *)local_58._16_8_ != (code *)0x0) {
                          (*(code *)local_58._16_8_)
                                    ((EnumHandlerFun<tinyusdz::GeomBasisCurves::Type> *)local_58,
                                     (EnumHandlerFun<tinyusdz::GeomBasisCurves::Type> *)local_58,3);
                        }
                        if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                          operator_delete((void *)local_3c0._0_8_,
                                          CONCAT26(local_3c0._22_2_,
                                                   CONCAT15(local_3c0[0x15],
                                                            CONCAT14(local_3c0[0x14],
                                                                     local_3c0._16_4_))) + 1);
                        }
                        iVar6 = 1;
                        if (bVar5) {
                          AttrMetas::operator=(&local_350->_metas,(AttrMetas *)(p_Var10 + 7));
                          pcVar12 = "type";
                          pcVar11 = "";
LAB_001fcb5d:
                          local_3c0._0_8_ = local_3c0 + 0x10;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_3c0,pcVar12,pcVar11);
                          ::std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&local_348,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3c0);
                          if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                            operator_delete((void *)local_3c0._0_8_,
                                            CONCAT26(local_3c0._22_2_,
                                                     CONCAT15(local_3c0[0x15],
                                                              CONCAT14(local_3c0[0x14],
                                                                       local_3c0._16_4_))) + 1);
                          }
                          iVar6 = 3;
                        }
LAB_001fcb8f:
                        if ((code *)local_308._0_8_ != (code *)0x0) {
                          (*(code *)local_308._0_8_)(local_318,local_318,3);
                        }
                      }
                    }
                    else {
                      iVar6 = ::std::__cxx11::string::compare((char *)__k);
                      p_Var2 = &local_348._M_impl.super__Rb_tree_header;
                      if (iVar6 == 0) {
                        local_318._0_8_ = local_308;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_318,"basis","");
                        cVar9 = ::std::
                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::find(&local_348,(key_type *)local_318);
                        if ((undefined1 *)local_318._0_8_ != local_308) {
                          operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                        }
                        iVar6 = 3;
                        if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
                          if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000)
                          {
                            local_318._0_8_ = local_308;
                            local_318._8_8_ = 0;
                            local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
                          }
                          else {
                            Attribute::type_name_abi_cxx11_((string *)local_318,&local_390->_attrib)
                            ;
                          }
                          local_3c0._0_8_ = local_3c0 + 0x10;
                          local_3c0[0x14] = 'n';
                          local_3c0._16_4_ = 0x656b6f74;
                          local_3c0._8_8_ =
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x5;
                          local_3c0[0x15] = '\0';
                          if (((local_318._8_8_ == 5) &&
                              (iVar6 = bcmp((void *)local_318._0_8_,local_3c0 + 0x10,5), iVar6 == 0)
                              ) && (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), uVar3 < 2
                                   )) {
                            if ((undefined1 *)local_318._0_8_ != local_308) {
                              operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                            }
                            if (uVar3 == 0) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_318);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,"[warn]",6);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,"():",3);
                              poVar7 = (ostream *)
                                       ::std::ostream::operator<<((ostringstream *)local_318,0xc41);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,"No value assigned to `",0x16);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,"basis",5);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,
                                         "` token attribute. Set default token value.",0x2b);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_318,"\n",1);
                              if (local_388 != (string *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_3c0,&local_3e0,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_398);
                                ::std::__cxx11::string::operator=
                                          ((string *)local_388,(string *)local_3c0);
                                if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                                  operator_delete((void *)local_3c0._0_8_,
                                                  CONCAT26(local_3c0._22_2_,
                                                           CONCAT15(local_3c0[0x15],
                                                                    CONCAT14(local_3c0[0x14],
                                                                             local_3c0._16_4_))) + 1
                                                 );
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                                  operator_delete(local_3e0._M_dataplus._M_p,
                                                  local_3e0.field_2._M_allocated_capacity + 1);
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_318);
                              ::std::ios_base::~ios_base(local_2a8);
                              AttrMetas::operator=(&local_358->_metas,(AttrMetas *)(p_Var10 + 7));
                              pcVar12 = "basis";
                              pcVar11 = "";
                              goto LAB_001fc9b3;
                            }
                          }
                          else if ((undefined1 *)local_318._0_8_ != local_308) {
                            operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                          }
                          local_318._0_8_ = (pointer)0x0;
                          local_318._8_8_ = 0;
                          local_308._8_8_ =
                               ::std::
                               _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3083:23)>
                               ::_M_invoke;
                          local_308._0_8_ =
                               ::std::
                               _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3083:23)>
                               ::_M_manager;
                          local_3c0._0_8_ = local_3c0 + 0x10;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_3c0,"basis","");
                          bVar5 = options->strict_allowedToken_check;
                          local_68 = (code *)0x0;
                          _Stack_60._M_p = (pointer)0x0;
                          local_78._M_unused._M_object = (pointer)0x0;
                          local_78._8_4_ = ResetToExplicit;
                          local_78._12_4_ = EmptyAttrib;
                          if ((code *)local_308._0_8_ != (code *)0x0) {
                            (*(code *)local_308._0_8_)(&local_78,local_318,2);
                            local_68 = (code *)local_308._0_8_;
                            _Stack_60._M_p = (pointer)local_308._8_8_;
                          }
                          target = local_398;
                          bVar5 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Basis,tinyusdz::GeomBasisCurves::Basis>
                                            ((string *)local_3c0,bVar5,
                                             (EnumHandlerFun<tinyusdz::GeomBasisCurves::Basis> *)
                                             &local_78,&local_390->_attrib,local_358,local_388,
                                             (string *)local_398);
                          if (local_68 != (code *)0x0) {
                            (*local_68)(&local_78,&local_78,__destroy_functor);
                          }
                          if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                            operator_delete((void *)local_3c0._0_8_,
                                            CONCAT26(local_3c0._22_2_,
                                                     CONCAT15(local_3c0[0x15],
                                                              CONCAT14(local_3c0[0x14],
                                                                       local_3c0._16_4_))) + 1);
                          }
                          iVar6 = 1;
                          if (bVar5) {
                            AttrMetas::operator=(&local_358->_metas,(AttrMetas *)(p_Var10 + 7));
                            pcVar12 = "basis";
                            pcVar11 = "";
                            goto LAB_001fcb5d;
                          }
                          goto LAB_001fcb8f;
                        }
                      }
                      else {
                        iVar6 = ::std::__cxx11::string::compare((char *)__k);
                        if (iVar6 == 0) {
                          local_318._0_8_ = local_308;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_318,"wrap","");
                          cVar9 = ::std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::find(&local_348,(key_type *)local_318);
                          if ((undefined1 *)local_318._0_8_ != local_308) {
                            operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                          }
                          iVar6 = 3;
                          if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
                            if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000
                               ) {
                              local_318._0_8_ = local_308;
                              local_318._8_8_ = 0;
                              local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
                            }
                            else {
                              Attribute::type_name_abi_cxx11_
                                        ((string *)local_318,&local_390->_attrib);
                            }
                            local_3c0._0_8_ = local_3c0 + 0x10;
                            local_3c0[0x14] = 'n';
                            local_3c0._16_4_ = 0x656b6f74;
                            local_3c0._8_8_ =
                                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)0x5;
                            local_3c0[0x15] = '\0';
                            if (((local_318._8_8_ == 5) &&
                                (iVar6 = bcmp((void *)local_318._0_8_,local_3c0 + 0x10,5),
                                iVar6 == 0)) &&
                               (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), uVar3 < 2)) {
                              if ((undefined1 *)local_318._0_8_ != local_308) {
                                operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1)
                                               );
                              }
                              if (uVar3 == 0) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_318);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,"[warn]",6);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           ,0x5a);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,"ReconstructPrim",0xf);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,"():",3);
                                poVar7 = (ostream *)
                                         ::std::ostream::operator<<
                                                   ((ostringstream *)local_318,0xc43);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,"No value assigned to `",0x16);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,"wrap",4);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,
                                           "` token attribute. Set default token value.",0x2b);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_318,"\n",1);
                                if (local_388 != (string *)0x0) {
                                  ::std::__cxx11::stringbuf::str();
                                  ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_3c0,&local_3e0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_398);
                                  ::std::__cxx11::string::operator=
                                            ((string *)local_388,(string *)local_3c0);
                                  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                                    operator_delete((void *)local_3c0._0_8_,
                                                    CONCAT26(local_3c0._22_2_,
                                                             CONCAT15(local_3c0[0x15],
                                                                      CONCAT14(local_3c0[0x14],
                                                                               local_3c0._16_4_))) +
                                                    1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                                    operator_delete(local_3e0._M_dataplus._M_p,
                                                    local_3e0.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_318);
                                ::std::ios_base::~ios_base(local_2a8);
                                AttrMetas::operator=(&local_360->_metas,(AttrMetas *)(p_Var10 + 7));
                                pcVar12 = "wrap";
                                pcVar11 = "";
                                goto LAB_001fc9b3;
                              }
                            }
                            else if ((undefined1 *)local_318._0_8_ != local_308) {
                              operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
                            }
                            local_318._0_8_ = (pointer)0x0;
                            local_318._8_8_ = 0;
                            local_308._8_8_ =
                                 ::std::
                                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3106:22)>
                                 ::_M_invoke;
                            local_308._0_8_ =
                                 ::std::
                                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3106:22)>
                                 ::_M_manager;
                            local_3c0._0_8_ = local_3c0 + 0x10;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_3c0,"wrap","");
                            bVar5 = options->strict_allowedToken_check;
                            local_88 = (pointer)0x0;
                            pSStack_80 = (pointer)0x0;
                            local_98._M_unused._M_object = (_Base_ptr)0x0;
                            local_98._8_8_ = 0;
                            if ((code *)local_308._0_8_ != (code *)0x0) {
                              (*(code *)local_308._0_8_)(&local_98,local_318,2);
                              local_88 = (pointer)local_308._0_8_;
                              pSStack_80 = (pointer)local_308._8_8_;
                            }
                            target = local_398;
                            bVar5 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Wrap,tinyusdz::GeomBasisCurves::Wrap>
                                              ((string *)local_3c0,bVar5,
                                               (EnumHandlerFun<tinyusdz::GeomBasisCurves::Wrap> *)
                                               &local_98,&local_390->_attrib,local_360,local_388,
                                               (string *)local_398);
                            if (local_88 != (pointer)0x0) {
                              (*(code *)local_88)(&local_98,&local_98,3);
                            }
                            if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                              operator_delete((void *)local_3c0._0_8_,
                                              CONCAT26(local_3c0._22_2_,
                                                       CONCAT15(local_3c0[0x15],
                                                                CONCAT14(local_3c0[0x14],
                                                                         local_3c0._16_4_))) + 1);
                            }
                            iVar6 = 1;
                            if (bVar5) {
                              AttrMetas::operator=(&local_360->_metas,(AttrMetas *)(p_Var10 + 7));
                              pcVar12 = "wrap";
                              pcVar11 = "";
                              goto LAB_001fcb5d;
                            }
                            goto LAB_001fcb8f;
                          }
                        }
                        else {
                          cVar9 = ::std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::find(&local_348,(key_type *)__k);
                          if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
                            this = ::std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                 *)local_2a8._264_8_,(key_type *)__k);
                            Property::operator=(this,local_390);
                            ::std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string_const&>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&local_348,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__k);
                          }
                          cVar9 = ::std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::find(&local_348,(key_type *)__k);
                          iVar6 = 0;
                          if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"[warn]",6);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_318,"():",3);
                            poVar7 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_318,0xc47);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_3c0,"Unsupported/unimplemented property: ",
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)__k);
                            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)local_318,(char *)local_3c0._0_8_,
                                                local_3c0._8_8_);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                            if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                              operator_delete((void *)local_3c0._0_8_,
                                              CONCAT26(local_3c0._22_2_,
                                                       CONCAT15(local_3c0[0x15],
                                                                CONCAT14(local_3c0[0x14],
                                                                         local_3c0._16_4_))) + 1);
                            }
                            if (local_388 != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_3c0,&local_3e0,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_398);
                              ::std::__cxx11::string::operator=
                                        ((string *)local_388,(string *)local_3c0);
                              if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                                operator_delete((void *)local_3c0._0_8_,
                                                CONCAT26(local_3c0._22_2_,
                                                         CONCAT15(local_3c0[0x15],
                                                                  CONCAT14(local_3c0[0x14],
                                                                           local_3c0._16_4_))) + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                                operator_delete(local_3e0._M_dataplus._M_p,
                                                local_3e0.field_2._M_allocated_capacity + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_318);
                            ::std::ios_base::~ios_base(local_2a8);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_001fcbae:
        if ((iVar6 != 3) && (iVar6 != 0)) break;
        p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10);
        aVar14._0_1_ = p_Var10 == local_168;
      } while (p_Var10 != local_168);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_348,(_Link_type)local_348._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(aVar14._0_1_ & 1);
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomBasisCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  DCOUT("GeomBasisCurves");

  auto BasisHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Basis, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Basis, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Basis::Bezier, "bezier"),
        std::make_pair(GeomBasisCurves::Basis::Bspline, "bspline"),
        std::make_pair(GeomBasisCurves::Basis::CatmullRom, "catmullRom"),
    };

    return EnumHandler<GeomBasisCurves::Basis>("basis", tok, enums);
  };

  auto TypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Type, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Type, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Type::Cubic, "cubic"),
        std::make_pair(GeomBasisCurves::Type::Linear, "linear"),
    };

    return EnumHandler<GeomBasisCurves::Type>("type", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Wrap, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Wrap::Nonperiodic, "nonperiodic"),
        std::make_pair(GeomBasisCurves::Wrap::Periodic, "periodic"),
        std::make_pair(GeomBasisCurves::Wrap::Pinned, "periodic"),
    };

    return EnumHandler<GeomBasisCurves::Wrap>("wrap", tok, enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomBasisCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomBasisCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomBasisCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomBasisCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomBasisCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomBasisCurves, curves->widths)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "type", GeomBasisCurves::Type, TypeHandler, GeomBasisCurves,
                       curves->type, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "basis", GeomBasisCurves::Basis, BasisHandler, GeomBasisCurves,
                       curves->basis, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "wrap", GeomBasisCurves::Wrap, WrapHandler, GeomBasisCurves,
                       curves->wrap, options.strict_allowedToken_check)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}